

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

void __thiscall llvm::sys::fs::TempFile::TempFile(TempFile *this,StringRef Name,int FD)

{
  char *pcVar1;
  
  pcVar1 = Name.Data;
  this->Done = false;
  (this->TmpName)._M_dataplus._M_p = (pointer)&(this->TmpName).field_2;
  if (pcVar1 == (char *)0x0) {
    (this->TmpName)._M_string_length = 0;
    (this->TmpName).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->TmpName,pcVar1,pcVar1 + Name.Length);
  }
  this->FD = FD;
  return;
}

Assistant:

TempFile::TempFile(StringRef Name, int FD) : TmpName(Name), FD(FD) {}